

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.h
# Opt level: O1

char * __thiscall
btSliderConstraint::serialize(btSliderConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  int i_2;
  btTransform *pbVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  pbVar4 = &this->m_frameInA;
  lVar5 = (long)dataBuffer + 0x40;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      *(btScalar *)(lVar5 + lVar7 * 4) = (pbVar4->m_basis).m_el[0].m_floats[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    pbVar4 = (btTransform *)((pbVar4->m_basis).m_el + 1);
  } while (lVar6 != 3);
  lVar5 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar5 * 4 + 0x70) = (this->m_frameInA).m_origin.m_floats[lVar5]
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  pbVar4 = &this->m_frameInB;
  lVar5 = (long)dataBuffer + 0x80;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      *(btScalar *)(lVar5 + lVar7 * 4) = (pbVar4->m_basis).m_el[0].m_floats[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    pbVar4 = (btTransform *)((pbVar4->m_basis).m_el + 1);
  } while (lVar6 != 3);
  lVar5 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar5 * 4 + 0xb0) = (this->m_frameInB).m_origin.m_floats[lVar5]
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  bVar1 = this->m_lowerLinLimit;
  bVar2 = this->m_lowerAngLimit;
  bVar3 = this->m_upperAngLimit;
  *(btScalar *)((long)dataBuffer + 0xc0) = this->m_upperLinLimit;
  *(btScalar *)((long)dataBuffer + 0xc4) = bVar1;
  *(btScalar *)((long)dataBuffer + 200) = bVar3;
  *(btScalar *)((long)dataBuffer + 0xcc) = bVar2;
  *(uint *)((long)dataBuffer + 0xd0) = (uint)this->m_useLinearReferenceFrameA;
  *(uint *)((long)dataBuffer + 0xd4) = (uint)this->m_useOffsetForConstraintFrame;
  return "btSliderConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btSliderConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btSliderConstraintData2* sliderData = (btSliderConstraintData2*) dataBuffer;
	btTypedConstraint::serialize(&sliderData->m_typeConstraintData,serializer);

	m_frameInA.serialize(sliderData->m_rbAFrame);
	m_frameInB.serialize(sliderData->m_rbBFrame);

	sliderData->m_linearUpperLimit = m_upperLinLimit;
	sliderData->m_linearLowerLimit = m_lowerLinLimit;

	sliderData->m_angularUpperLimit = m_upperAngLimit;
	sliderData->m_angularLowerLimit = m_lowerAngLimit;

	sliderData->m_useLinearReferenceFrameA = m_useLinearReferenceFrameA;
	sliderData->m_useOffsetForConstraintFrame = m_useOffsetForConstraintFrame;

	return btSliderConstraintDataName;
}